

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.hpp
# Opt level: O2

int32_t duckdb::TryAbsOperator::Operation<int,int>(int32_t input)

{
  if (input < 1) {
    input = -input;
  }
  return input;
}

Assistant:

inline int32_t TryAbsOperator::Operation(int32_t input) {
	if (input == NumericLimits<int32_t>::Minimum()) {
		throw OutOfRangeException("Overflow on abs(%d)", input);
	}
	return AbsOperator::Operation<int32_t, int32_t>(input);
}